

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# space2.cpp
# Opt level: O0

void drop_bomb_proc(Am_Object *param_1)

{
  byte bVar1;
  ushort uVar2;
  int iVar3;
  int iVar4;
  Am_Value *pAVar5;
  Am_Object *pAVar6;
  Am_Object local_70;
  Am_Object local_68;
  Am_Object local_60;
  uint local_58;
  uint local_54;
  int bomb_top;
  int bomb_left;
  Am_Object new_bomb;
  Am_Object bomb_owner;
  Am_Object local_30;
  Am_Object alien;
  Am_Value_List aliens;
  int local_18;
  int alien_shooting;
  int num_aliens;
  Am_Object *param_0_local;
  
  iVar3 = rand();
  if ((iVar3 >> 5 & 1U) == 0) {
    pAVar5 = (Am_Value *)Am_Object::Get(0xb2e8,(ulong)NUM_ALIENS);
    iVar3 = Am_Value::operator_cast_to_int(pAVar5);
    if (iVar3 != 0) {
      iVar4 = rand();
      local_18 = (iVar4 >> 4) % iVar3 + 1;
      pAVar5 = (Am_Value *)Am_Object::Get(0xb2e8,0x82);
      Am_Value_List::Am_Value_List((Am_Value_List *)&alien,pAVar5);
      Am_Object::Am_Object(&local_30);
      Am_Value_List::Start();
      while (bVar1 = Am_Value_List::Last(), ((bVar1 ^ 0xff) & 1) != 0) {
        pAVar5 = (Am_Value *)Am_Value_List::Get();
        Am_Object::operator=(&local_30,pAVar5);
        Am_Object::Get((ushort)&local_30,0xb0);
        bVar1 = Am_Value::Valid();
        if ((bVar1 & 1) != 0) {
          local_18 = local_18 + -1;
        }
        if (local_18 == 0) break;
        Am_Object::operator=(&local_30,(Am_Object *)&Am_No_Object);
        Am_Value_List::Next();
      }
      bVar1 = Am_Object::operator==(&local_30,(Am_Object *)&Am_No_Object);
      if ((bVar1 & 1) == 0) {
        Am_Object::Get_Owner(&new_bomb,0x10b2c8);
        Am_Object::Am_Object((Am_Object *)&bomb_top);
        pAVar5 = (Am_Value *)Am_Object::Get((ushort)&local_30,100);
        iVar3 = Am_Value::operator_cast_to_int(pAVar5);
        pAVar5 = (Am_Value *)Am_Object::Get((ushort)&local_30,0x66);
        iVar4 = Am_Value::operator_cast_to_int(pAVar5);
        local_54 = iVar3 + iVar4 / 2;
        pAVar5 = (Am_Value *)Am_Object::Get((ushort)&local_30,0x65);
        iVar3 = Am_Value::operator_cast_to_int(pAVar5);
        pAVar5 = (Am_Value *)Am_Object::Get((ushort)&local_30,0x67);
        iVar4 = Am_Value::operator_cast_to_int(pAVar5);
        local_58 = iVar3 + iVar4;
        Am_Object::Get_Owner(&local_60,(Am_Slot_Flags)&local_30);
        Am_Translate_Coordinates
                  (&local_60,local_54,local_58,&new_bomb,(int *)&local_54,(int *)&local_58);
        Am_Object::~Am_Object(&local_60);
        Am_Object::Create((char *)&local_70);
        uVar2 = Am_Object::Set((ushort)&local_70,100,(ulong)local_54);
        pAVar6 = (Am_Object *)Am_Object::Set(uVar2,0x65,(ulong)local_58);
        pAVar6 = (Am_Object *)Am_Object::operator=((Am_Object *)&bomb_top,pAVar6);
        Am_Object::Am_Object(&local_68,pAVar6);
        Am_Object::Add_Part((Am_Object_Data *)&new_bomb,SUB81(&local_68,0),1);
        Am_Object::~Am_Object(&local_68);
        Am_Object::~Am_Object(&local_70);
        Am_Object::Set((ushort)&bomb_top,0x65,1000);
        Am_Object::~Am_Object((Am_Object *)&bomb_top);
        Am_Object::~Am_Object(&new_bomb);
      }
      else {
        std::operator<<((ostream *)&std::cout,"Oops.\n");
      }
      Am_Object::~Am_Object(&local_30);
      Am_Value_List::~Am_Value_List((Am_Value_List *)&alien);
    }
  }
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, drop_bomb, (Am_Object /*cmd*/))
{
  // Only drop a bomb 50% of the time we call this, for some variation.
  if (rand() >> 5 & 0x1)
    return; // test one of the middle bits
  int num_aliens = Aliens.Get(NUM_ALIENS);
  if (!num_aliens)
    return; // no one is left to shoot!

  // Not an even distribution, but it'll do.
  int alien_shooting = (rand() >> 4) % num_aliens + 1;
  Am_Value_List aliens = Aliens.Get(Am_GRAPHICAL_PARTS);
  Am_Object alien;
  for (aliens.Start(); !aliens.Last(); aliens.Next()) {
    alien = aliens.Get();
    //    if (alien.Get(Am_LINE_STYLE) != Am_No_Style)  // alien is not dead
    if (alien.Get(Am_IMAGE).Valid())
      alien_shooting--;
    if (alien_shooting)
      alien = Am_No_Object;
    else
      break;
  }
  if (alien == Am_No_Object) {
    cout << "Oops.\n";
    return;
  }
  // now alien contains the alien we're dealing with.
  Am_Object bomb_owner = Ship.Get_Owner();
  Am_Object new_bomb;
  int bomb_left = (int)alien.Get(Am_LEFT) + (int)alien.Get(Am_WIDTH) / 2;
  int bomb_top = (int)alien.Get(Am_TOP) + (int)alien.Get(Am_HEIGHT);
  Am_Translate_Coordinates(alien.Get_Owner(), bomb_left, bomb_top, bomb_owner,
                           bomb_left, bomb_top);
  bomb_owner.Add_Part(new_bomb = Bomb.Create("Live_Bomb")
                                     .Set(Am_LEFT, bomb_left)
                                     .Set(Am_TOP, bomb_top));
  // send the bomb downscreen
  new_bomb.Set(Am_TOP, 1000);
}